

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long lVar5;
  bool bVar6;
  stringstream stream;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar3 = (uint)str;
  if (uVar3 == 0xffffffff) {
    sVar2 = wcslen((wchar_t *)this);
    uVar3 = (uint)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (0 < (int)uVar3) {
    uVar4 = extraout_RDX;
    lVar5 = 0;
    while (uVar1 = *(uint *)(this + lVar5 * 4), uVar1 != 0) {
      CodePointToUtf8_abi_cxx11_(&local_1d8,(internal *)(ulong)uVar1,(UInt32)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      uVar4 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
        uVar4 = extraout_RDX_01;
      }
      if ((uVar1 == 0) || (bVar6 = (ulong)uVar3 - 1 == lVar5, lVar5 = lVar5 + 1, bVar6)) break;
    }
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}